

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

SearchResult<int,_false> __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
::
binary_search_impl<phmap::test_internal::MovableOnlyInstance,phmap::priv::upper_bound_adapter<std::less<phmap::test_internal::MovableOnlyInstance>>>
          (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
           *this,ulong *k,int s,int e)

{
  template_ElementType<2UL> *ptVar1;
  int iVar2;
  
  while (iVar2 = e, s != iVar2) {
    e = s + iVar2 >> 1;
    ptVar1 = GetField<2ul>(this);
    test_internal::BaseCountedInstance::num_comparisons_ =
         test_internal::BaseCountedInstance::num_comparisons_ + 1;
    if (ptVar1[e].super_BaseCountedInstance.value_ <= *k) {
      s = e + 1;
      e = iVar2;
    }
  }
  return (SearchResult<int,_false>)iVar2;
}

Assistant:

SearchResult<int, false> binary_search_impl(
            const K &k, int s, int e, const Compare &comp,
            std::false_type /* IsCompareTo */) const {
            while (s != e) {
                const int mid = (s + e) >> 1;
                if (comp(key(mid), k)) {
                    s = mid + 1;
                } else {
                    e = mid;
                }
            }
            return {s};
        }